

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O1

void R_DrawVisSprite(vissprite_t *vis)

{
  int iVar1;
  FTexture *pFVar2;
  long *plVar3;
  undefined8 *puVar4;
  bool bVar5;
  double dVar6;
  ushort uVar7;
  ESPSResult EVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar10;
  int zz;
  long lVar11;
  int iVar12;
  int iVar13;
  fixed_t fVar14;
  bool bVar15;
  Span *spans;
  Span *local_40;
  int local_34;
  
  if (vis->sector == (sector_t *)0x0) {
    bVar5 = true;
    if (((vis->gpos).X == 0.0) && ((vis->gpos).Y == 0.0)) {
      bVar5 = (vis->gpos).Z != 0.0;
    }
  }
  else {
    bVar5 = false;
  }
  if ((vis->xscale != 0) && (vis->yscale != 0.0)) {
    dc_colormap = (vis->Style).colormap;
    EVar8 = R_SetPatchStyle((vis->Style).RenderStyle,
                            SUB84((double)(vis->Style).Alpha + 103079215104.0,0),vis->Translation,
                            vis->FillColor);
    if ((vis->Style).RenderStyle.AsDWORD == LegacyRenderStyles[8].AsDWORD) {
      dc_colormap = dc_colormap + (ulong)vis->ColormapNum * 0x100;
    }
    if (EVar8 != DontDraw) {
      if (EVar8 == DoDraw0) {
        uVar7 = vis->x1;
      }
      else {
        uVar7 = vis->x2 & 0xfffc;
      }
      pFVar2 = (vis->field_13).pic;
      dVar6 = (double)vis->yscale;
      dc_iscale = SUB84((double)(1.0 / vis->yscale) + 103079215104.0,0);
      fVar14 = (vis->field_14).field_0.startfrac;
      iVar1 = (vis->field_14).field_0.xiscale;
      dc_texturemid = (vis->field_14).field_0.texturemid;
      sprflipvert = (vis->renderflags & 2) != 0;
      spryscale = dVar6;
      if (sprflipvert) {
        dc_iscale = -dc_iscale;
        dc_texturemid = dc_texturemid - (double)pFVar2->Height;
        spryscale = -dVar6;
      }
      sprtopscreen = CenterY - dc_texturemid * dVar6;
      dc_x = (int)vis->x1;
      local_34 = (int)vis->x2;
      if (vis->x1 < vis->x2) {
        iVar10 = (int)(short)uVar7;
        if ((dc_x & 3U) != 0 && dc_x < iVar10) {
          do {
            iVar9 = (*pFVar2->_vptr_FTexture[2])(pFVar2,(ulong)(uint)(fVar14 >> 0x10),&local_40);
            if ((bVar5) || (CurrentPortalInSkybox != false)) {
LAB_0031530d:
              R_DrawMaskedColumn((BYTE *)CONCAT44(extraout_var,iVar9),local_40);
            }
            else {
              bVar15 = (ulong)portaldrawsegs.Count != 0;
              if (bVar15) {
                bVar15 = true;
                lVar11 = 0;
                do {
                  plVar3 = *(long **)((long)portaldrawsegs.Array + lVar11);
                  iVar12 = 3;
                  if ((((int)plVar3[0x12] == CurrentPortalUniq) &&
                      (puVar4 = *(undefined8 **)(*plVar3 + 0x18),
                      1.52587890625e-05 <
                      (*(double *)*puVar4 - (double)(vis->gpos).X) * (double)puVar4[3] +
                      ((double)(vis->gpos).Y - ((double *)*puVar4)[1]) * (double)puVar4[2])) &&
                     ((dc_x < (short)plVar3[3] ||
                      (iVar12 = 1, *(short *)((long)plVar3 + 0x1a) <= dc_x)))) {
                    iVar12 = 0;
                  }
                  if ((iVar12 != 3) && (iVar12 != 0)) break;
                  lVar11 = lVar11 + 8;
                  bVar15 = (ulong)portaldrawsegs.Count << 3 != lVar11;
                } while (bVar15);
              }
              if (!bVar15) goto LAB_0031530d;
            }
            dc_x = dc_x + 1;
            fVar14 = fVar14 + iVar1;
          } while ((dc_x < iVar10) && ((dc_x & 3U) != 0));
        }
        while (dc_x < iVar10) {
          rt_initcols((BYTE *)0x0);
          iVar12 = 4;
          iVar9 = dc_x;
          do {
            dc_x = iVar9;
            iVar9 = (*pFVar2->_vptr_FTexture[2])(pFVar2,(ulong)(uint)(fVar14 >> 0x10),&local_40);
            if ((bVar5) || (CurrentPortalInSkybox != false)) {
LAB_00315459:
              R_DrawMaskedColumnHoriz((BYTE *)CONCAT44(extraout_var_00,iVar9),local_40);
            }
            else {
              bVar15 = (ulong)portaldrawsegs.Count != 0;
              if (bVar15) {
                bVar15 = true;
                lVar11 = 0;
                do {
                  plVar3 = *(long **)((long)portaldrawsegs.Array + lVar11);
                  iVar13 = 3;
                  if ((((int)plVar3[0x12] == CurrentPortalUniq) &&
                      (puVar4 = *(undefined8 **)(*plVar3 + 0x18),
                      1.52587890625e-05 <
                      (*(double *)*puVar4 - (double)(vis->gpos).X) * (double)puVar4[3] +
                      ((double)(vis->gpos).Y - ((double *)*puVar4)[1]) * (double)puVar4[2])) &&
                     ((dc_x < (short)plVar3[3] ||
                      (iVar13 = 1, *(short *)((long)plVar3 + 0x1a) <= dc_x)))) {
                    iVar13 = 0;
                  }
                  if ((iVar13 != 3) && (iVar13 != 0)) break;
                  lVar11 = lVar11 + 8;
                  bVar15 = (ulong)portaldrawsegs.Count << 3 != lVar11;
                } while (bVar15);
              }
              if (!bVar15) goto LAB_00315459;
            }
            fVar14 = fVar14 + iVar1;
            iVar12 = iVar12 + -1;
            iVar9 = dc_x + 1;
          } while (iVar12 != 0);
          iVar9 = dc_x + -3;
          dc_x = dc_x + 1;
          rt_draw4cols(iVar9);
        }
        if (dc_x < local_34) {
          do {
            iVar10 = (*pFVar2->_vptr_FTexture[2])(pFVar2,(ulong)(uint)(fVar14 >> 0x10),&local_40);
            if ((bVar5) || (CurrentPortalInSkybox != false)) {
LAB_003155af:
              R_DrawMaskedColumn((BYTE *)CONCAT44(extraout_var_01,iVar10),local_40);
            }
            else {
              bVar15 = (ulong)portaldrawsegs.Count != 0;
              if (bVar15) {
                bVar15 = true;
                lVar11 = 0;
                do {
                  plVar3 = *(long **)((long)portaldrawsegs.Array + lVar11);
                  iVar9 = 3;
                  if ((((int)plVar3[0x12] == CurrentPortalUniq) &&
                      (puVar4 = *(undefined8 **)(*plVar3 + 0x18),
                      1.52587890625e-05 <
                      (*(double *)*puVar4 - (double)(vis->gpos).X) * (double)puVar4[3] +
                      ((double)(vis->gpos).Y - ((double *)*puVar4)[1]) * (double)puVar4[2])) &&
                     ((dc_x < (short)plVar3[3] ||
                      (iVar9 = 1, *(short *)((long)plVar3 + 0x1a) <= dc_x)))) {
                    iVar9 = 0;
                  }
                  if ((iVar9 != 3) && (iVar9 != 0)) break;
                  lVar11 = lVar11 + 8;
                  bVar15 = (ulong)portaldrawsegs.Count << 3 != lVar11;
                } while (bVar15);
              }
              if (!bVar15) goto LAB_003155af;
            }
            dc_x = dc_x + 1;
            fVar14 = fVar14 + iVar1;
          } while (dc_x < local_34);
        }
      }
    }
    R_FinishSetPatchStyle();
    NetUpdate();
  }
  return;
}

Assistant:

void R_DrawVisSprite (vissprite_t *vis)
{
	const BYTE *pixels;
	const FTexture::Span *spans;
	fixed_t 		frac;
	FTexture		*tex;
	int				x2, stop4;
	fixed_t			xiscale;
	ESPSResult		mode;
	bool			ispsprite = (!vis->sector && vis->gpos != FVector3(0, 0, 0));

	if (vis->xscale == 0 || vis->yscale == 0)
	{ // scaled to 0; can't see
		return;
	}

	fixed_t centeryfrac = FLOAT2FIXED(CenterY);
	dc_colormap = vis->Style.colormap;

	mode = R_SetPatchStyle (vis->Style.RenderStyle, vis->Style.Alpha, vis->Translation, vis->FillColor);

	if (vis->Style.RenderStyle == LegacyRenderStyles[STYLE_Shaded])
	{ // For shaded sprites, R_SetPatchStyle sets a dc_colormap to an alpha table, but
	  // it is the brightest one. We need to get back to the proper light level for
	  // this sprite.
		dc_colormap += vis->ColormapNum << COLORMAPSHIFT;
	}

	if (mode != DontDraw)
	{
		if (mode == DoDraw0)
		{
			// One column at a time
			stop4 = vis->x1;
		}
		else	 // DoDraw1
		{
			// Up to four columns at a time
			stop4 = vis->x2 & ~3;
		}

		tex = vis->pic;
		spryscale = vis->yscale;
		sprflipvert = false;
		dc_iscale = FLOAT2FIXED(1 / vis->yscale);
		frac = vis->startfrac;
		xiscale = vis->xiscale;
		dc_texturemid = vis->texturemid;

		if (vis->renderflags & RF_YFLIP)
		{
			sprflipvert = true;
			spryscale = -spryscale;
			dc_iscale = -dc_iscale;
			dc_texturemid -= vis->pic->GetHeight();
			sprtopscreen = CenterY + dc_texturemid * spryscale;
		}
		else
		{
			sprflipvert = false;
			sprtopscreen = CenterY - dc_texturemid * spryscale;
		}

		dc_x = vis->x1;
		x2 = vis->x2;

		if (dc_x < x2)
		{
			while ((dc_x < stop4) && (dc_x & 3))
			{
				pixels = tex->GetColumn (frac >> FRACBITS, &spans);
				if (ispsprite || !R_ClipSpriteColumnWithPortals(vis))
					R_DrawMaskedColumn (pixels, spans);
				dc_x++;
				frac += xiscale;
			}

			while (dc_x < stop4)
			{
				rt_initcols();
				for (int zz = 4; zz; --zz)
				{
					pixels = tex->GetColumn (frac >> FRACBITS, &spans);
					if (ispsprite || !R_ClipSpriteColumnWithPortals(vis))
						R_DrawMaskedColumnHoriz (pixels, spans);
					dc_x++;
					frac += xiscale;
				}
				rt_draw4cols (dc_x - 4);
			}

			while (dc_x < x2)
			{
				pixels = tex->GetColumn (frac >> FRACBITS, &spans);
				if (ispsprite || !R_ClipSpriteColumnWithPortals(vis))
					R_DrawMaskedColumn (pixels, spans);
				dc_x++;
				frac += xiscale;
			}
		}
	}

	R_FinishSetPatchStyle ();

	NetUpdate ();
}